

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O1

Node * __thiscall Lexical::mainProgram(Node *__return_storage_ptr__,Lexical *this)

{
  int *to_;
  pointer *ppiVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  int beginIndex;
  Node subSon;
  int local_ec;
  string local_e8;
  Node local_c8;
  int local_7c;
  Node local_78;
  
  Generator::pushIndex(&this->generator);
  local_ec = this->wordIndex;
  local_c8.name._M_dataplus._M_p._0_4_ = 0xffffffff;
  paVar3 = &local_78.name.field_2;
  local_78.name._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"main","");
  addProcedure(this,(int *)&local_c8,&local_78.name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != paVar3) {
    operator_delete(local_78.name._M_dataplus._M_p,local_78.name.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)((ulong)local_e8._M_dataplus._M_p._4_4_ << 0x20);
  paVar2 = &local_c8.name.field_2;
  local_c8.name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"main","");
  subProgram(&local_78,this,(int *)&local_e8,&local_c8.name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8.name._M_dataplus._M_p,local_c8.name.field_2._M_allocated_capacity + 1);
  }
  bVar4 = Node::operator==(&local_78,&nullNode);
  if (!bVar4) {
    lVar6 = (long)this->wordIndex + 1;
    this->wordIndex = (int)lVar6;
    iVar5 = std::__cxx11::string::compare
                      ((char *)((this->words).super__Vector_base<Word,_std::allocator<Word>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar6));
    if (iVar5 == 0) {
      local_c8.name._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"main","");
      to_ = &this->wordIndex;
      iVar5 = this->nodeCnt;
      this->nodeCnt = iVar5 + 1;
      local_e8._M_dataplus._M_p._0_4_ = iVar5;
      Node::Node(__return_storage_ptr__,&local_c8.name,(int *)&local_e8,&local_ec,to_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.name._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8.name._M_dataplus._M_p,
                        local_c8.name.field_2._M_allocated_capacity + 1);
      }
      std::vector<Node,std::allocator<Node>>::emplace_back<Node_const&>
                ((vector<Node,std::allocator<Node>> *)&__return_storage_ptr__->son,&local_78);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,".","");
      local_7c = this->nodeCnt;
      this->nodeCnt = local_7c + 1;
      Node::Node(&local_c8,&local_e8,&local_7c,to_,to_);
      std::vector<Node,std::allocator<Node>>::emplace_back<Node_const&>
                ((vector<Node,std::allocator<Node>> *)&__return_storage_ptr__->son,&local_c8);
      std::vector<Node,_std::allocator<Node>_>::~vector(&local_c8.son);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.name._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8.name._M_dataplus._M_p,
                        local_c8.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      this->lastErrorIndex = -1;
      this->lastErrorCode = -1;
      ppiVar1 = &(this->generator).sizeStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppiVar1 = *ppiVar1 + -1;
      goto LAB_001055e0;
    }
  }
  errorParsing(__return_storage_ptr__,this,&local_ec,-1,-1);
LAB_001055e0:
  std::vector<Node,_std::allocator<Node>_>::~vector(&local_78.son);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != paVar3) {
    operator_delete(local_78.name._M_dataplus._M_p,local_78.name.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Node mainProgram() {
		generator.pushIndex();
		int beginIndex = wordIndex;
		addProcedure(-1, "main");

		Node subSon = subProgram(0, "main");
		if (subSon == nullNode) return errorParsing(beginIndex);

		if (words[++wordIndex].token != ".") return errorParsing(beginIndex); // BASE ERROR

		Node now = Node("main", nodeCnt++, beginIndex, wordIndex);
		now.insertSon(subSon);
		now.insertSon(Node(".", nodeCnt++, wordIndex, wordIndex));

		lastErrorIndex = -1;
		lastErrorCode = -1;
		generator.popIndex();
		return now;
	}